

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O2

bool bssl::resolve_ecdhe_secret(SSL_HANDSHAKE *hs,SSL_CLIENT_HELLO *client_hello)

{
  uint16_t group_id;
  SSL *ssl;
  SSL_HANDSHAKE_HINTS *pSVar1;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> in_00;
  Span<const_unsigned_char> in_01;
  Span<const_unsigned_char> in_02;
  bool bVar2;
  char cVar3;
  int iVar4;
  uint8_t *out_alert;
  uint desc;
  Span<const_unsigned_char> in_03;
  uint8_t alert;
  bool found_key_share;
  UniquePtr<SSLKeyShare> key_share;
  Array<unsigned_char> secret;
  Span<const_unsigned_char> peer_key;
  ScopedCBB ciphertext;
  
  ssl = hs->ssl;
  group_id = ((hs->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
              _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->group_id;
  peer_key.data_ = (uchar *)0x0;
  peer_key.size_ = 0;
  out_alert = &alert;
  alert = '2';
  bVar2 = ssl_ext_key_share_parse_clienthello(hs,&found_key_share,&peer_key,out_alert,client_hello);
  if (!bVar2) {
    ssl_send_alert(ssl,2,(uint)alert);
    return false;
  }
  if (found_key_share == false) {
    ssl_send_alert(ssl,2,0x2f);
    ERR_put_error(0x10,0,0xf3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                  ,0x56);
    return false;
  }
  secret.data_ = (uchar *)0x0;
  secret.size_ = 0;
  pSVar1 = (hs->hints)._M_t.
           super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
  if ((((pSVar1 == (SSL_HANDSHAKE_HINTS *)0x0) || ((hs->field_0x6ca & 0x10) != 0)) ||
      (pSVar1->key_share_group_id != group_id)) || ((pSVar1->key_share_secret).size_ == 0)) {
    CBB_zero(&ciphertext.ctx_);
    SSLKeyShare::Create((SSLKeyShare *)&key_share,group_id);
    if (((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>)
         key_share._M_t.super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl ==
         (__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>)0x0) ||
       (iVar4 = CBB_init(&ciphertext.ctx_,0x20), iVar4 == 0)) {
LAB_001630d9:
      desc = (uint)alert;
    }
    else {
      out_alert = &alert;
      cVar3 = (**(code **)(*(long *)key_share._M_t.
                                    super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl
                          + 0x20))
                        (key_share._M_t.
                         super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl,&ciphertext,
                         &secret,out_alert,peer_key.data_,peer_key.size_);
      if ((cVar3 == '\0') ||
         (bVar2 = CBBFinishArray(&ciphertext.ctx_,&hs->key_share_ciphertext), !bVar2))
      goto LAB_001630d9;
      if ((pSVar1 == (SSL_HANDSHAKE_HINTS *)0x0) || ((hs->field_0x6ca & 0x10) == 0)) {
LAB_001630af:
        std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr(&key_share);
        internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                  (&ciphertext);
        goto LAB_001630c3;
      }
      pSVar1->key_share_group_id = group_id;
      in_01.data_ = (hs->key_share_ciphertext).data_;
      in_01.size_ = (hs->key_share_ciphertext).size_;
      bVar2 = Array<unsigned_char>::CopyFrom(&pSVar1->key_share_ciphertext,in_01);
      desc = 0x50;
      if ((bVar2) &&
         (in_02.size_ = secret.size_, in_02.data_ = secret.data_,
         bVar2 = Array<unsigned_char>::CopyFrom(&pSVar1->key_share_secret,in_02), bVar2))
      goto LAB_001630af;
    }
    ssl_send_alert(ssl,2,desc);
    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr(&key_share);
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&ciphertext);
  }
  else {
    in.data_ = (pSVar1->key_share_ciphertext).data_;
    in.size_ = (pSVar1->key_share_ciphertext).size_;
    bVar2 = Array<unsigned_char>::CopyFrom(&hs->key_share_ciphertext,in);
    if ((bVar2) &&
       (in_00.data_ = (pSVar1->key_share_secret).data_,
       in_00.size_ = (pSVar1->key_share_secret).size_,
       bVar2 = Array<unsigned_char>::CopyFrom(&secret,in_00), bVar2)) {
LAB_001630c3:
      in_03.size_ = (size_t)out_alert;
      in_03.data_ = (uchar *)secret.size_;
      bVar2 = tls13_advance_key_schedule((bssl *)hs,(SSL_HANDSHAKE *)secret.data_,in_03);
      goto LAB_00163101;
    }
    ssl_send_alert(ssl,2,0x50);
  }
  bVar2 = false;
LAB_00163101:
  Array<unsigned_char>::~Array(&secret);
  return bVar2;
}

Assistant:

static bool resolve_ecdhe_secret(SSL_HANDSHAKE *hs,
                                 const SSL_CLIENT_HELLO *client_hello) {
  SSL *const ssl = hs->ssl;
  const uint16_t group_id = hs->new_session->group_id;

  bool found_key_share;
  Span<const uint8_t> peer_key;
  uint8_t alert = SSL_AD_DECODE_ERROR;
  if (!ssl_ext_key_share_parse_clienthello(hs, &found_key_share, &peer_key,
                                           &alert, client_hello)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
    return false;
  }

  if (!found_key_share) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_ILLEGAL_PARAMETER);
    OPENSSL_PUT_ERROR(SSL, SSL_R_WRONG_CURVE);
    return false;
  }

  Array<uint8_t> secret;
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  if (hints && !hs->hints_requested && hints->key_share_group_id == group_id &&
      !hints->key_share_secret.empty()) {
    // Copy the key_share secret from hints.
    if (!hs->key_share_ciphertext.CopyFrom(hints->key_share_ciphertext) ||
        !secret.CopyFrom(hints->key_share_secret)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return false;
    }
  } else {
    ScopedCBB ciphertext;
    UniquePtr<SSLKeyShare> key_share = SSLKeyShare::Create(group_id);
    if (!key_share ||  //
        !CBB_init(ciphertext.get(), 32) ||
        !key_share->Encap(ciphertext.get(), &secret, &alert, peer_key) ||
        !CBBFinishArray(ciphertext.get(), &hs->key_share_ciphertext)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, alert);
      return false;
    }
    if (hints && hs->hints_requested) {
      hints->key_share_group_id = group_id;
      if (!hints->key_share_ciphertext.CopyFrom(hs->key_share_ciphertext) ||
          !hints->key_share_secret.CopyFrom(secret)) {
        ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
        return false;
      }
    }
  }

  return tls13_advance_key_schedule(hs, secret);
}